

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_next_header_empty.c
# Opt level: O0

void test_empty_file2_check(archive *a)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_entry *local_18;
  archive_entry *e;
  archive *a_local;
  
  e = (archive_entry *)a;
  iVar1 = archive_errno(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'1',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string((archive *)e);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
             ,L'2',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  wVar2 = archive_read_open_filename((archive_conflict *)e,"emptyfile",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'4',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, \"emptyfile\", 0)",(void *)0x0);
  iVar1 = archive_errno((archive *)e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'5',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string((archive *)e);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
             ,L'6',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header((archive *)e,&local_18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'8',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &e)",
                      (void *)0x0);
  iVar1 = archive_errno((archive *)e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'9',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string((archive *)e);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
             ,L':',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  archive_read_free((archive *)e);
  return;
}

Assistant:

static void
test_empty_file2_check(struct archive* a)
{
	struct archive_entry* e;
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_open_filename(a, "emptyfile", 0));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &e));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	archive_read_free(a);
}